

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall mp::ReadError::~ReadError(ReadError *this)

{
  ~ReadError(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~ReadError() throw() {}